

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<int,char_const(&)[4],int,char_const(&)[2]>
                   (string *__return_storage_ptr__,int *arg,char (*args) [4],int *args_1,
                   char (*args_2) [2])

{
  string local_60;
  string local_40;
  
  StringBuilder<int>(&local_40,arg);
  StringBuilder<char[4],int,char_const(&)[2]>(&local_60,args,args_1,args_2);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}